

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-history.c
# Opt level: O2

void history_display(void)

{
  keycode_t kVar1;
  _Bool _Var2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  keypress kVar10;
  wchar_t hgt;
  history_info *history_list_local;
  wchar_t wid;
  char buf [120];
  
  history_list_local = (history_info *)0x0;
  sVar4 = history_get_list(player,&history_list_local);
  Term_get_size(&wid,&hgt);
  lVar7 = (long)hgt;
  screen_save();
  sVar5 = history_display::first_item;
switchD_001c3ba3_caseD_6c:
  history_display::first_item = sVar5;
  Term_clear();
  c_put_str('\x01',"[Player history]",L'\0',L'\0');
  c_put_str('\x0e',"      Turn   Depth  Note",L'\x01',L'\0');
  sVar5 = history_display::first_item;
  lVar8 = history_display::first_item * 0x5c;
  lVar9 = 0;
  while( true ) {
    iVar6 = (int)(lVar7 + -5);
    if ((iVar6 < (int)lVar9) || (sVar4 <= lVar9 + sVar5)) break;
    strnfmt(buf,0x78,"%10ld%7d\'  %s",(long)*(int *)(history_list_local->event + lVar8 + -4),
            (ulong)(uint)(*(short *)(history_list_local->type + lVar8 + 2) * 0x32));
    _Var2 = flag_has_dbg(history_list_local->type + lVar8,2,4,"history_list_local[i].type",
                         "HIST_ARTIFACT_LOST");
    if (_Var2) {
      my_strcat(buf," (LOST)",0x78);
    }
    prt(buf,(int)lVar9 + L'\x02',L'\0');
    lVar8 = lVar8 + 0x5c;
    lVar9 = lVar9 + 1;
  }
  prt("[Arrow keys scroll, p/PgUp for previous page, n/PgDn for next page, ESC to exit.]",
      hgt + L'\xffffffff',L'\0');
  kVar10 = inkey();
  kVar1 = kVar10.code;
  sVar5 = history_display::first_item;
  switch(kVar1) {
  case 0x6a:
switchD_001c3ba3_caseD_6a:
    sVar5 = history_display::first_item + 1;
    break;
  case 0x6b:
switchD_001c3ba3_caseD_6b:
    uVar3 = (int)history_display::first_item - 1;
    goto LAB_001c3bd6;
  case 0x6c:
  case 0x6d:
  case 0x6f:
    goto switchD_001c3ba3_caseD_6c;
  case 0x6e:
switchD_001c3ba3_caseD_6e:
    sVar5 = history_display::first_item + lVar7 + -5;
    break;
  case 0x70:
switchD_001c3ba3_caseD_70:
    uVar3 = (int)history_display::first_item - iVar6;
LAB_001c3bd6:
    sVar5 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      sVar5 = 0;
    }
    goto switchD_001c3ba3_caseD_6c;
  default:
    if (kVar1 == 0x20) goto switchD_001c3ba3_caseD_6e;
    if (kVar1 == 0x80) goto switchD_001c3ba3_caseD_6a;
    if (kVar1 == 0x83) goto switchD_001c3ba3_caseD_6b;
    if (kVar1 == 0x95) goto switchD_001c3ba3_caseD_70;
    if (kVar1 == 0x97) goto switchD_001c3ba3_caseD_6e;
    if (kVar1 == 0xe000) {
      screen_load();
      return;
    }
    goto switchD_001c3ba3_caseD_6c;
  }
  if (sVar4 <= sVar5) {
    sVar5 = sVar4;
  }
  goto switchD_001c3ba3_caseD_6c;
}

Assistant:

void history_display(void)
{
	struct history_info *history_list_local = NULL;
	size_t max_item = history_get_list(player, &history_list_local);
	int row, wid, hgt, page_size;
	char buf[120];
	static size_t first_item = 0;
	size_t i;
	bool active = true;

	Term_get_size(&wid, &hgt);

	/* Five lines provide space for the header and footer */
	page_size = hgt - 5;

	screen_save();

	while (active)
	{
		struct keypress ch;

		Term_clear();

		/* Print everything to screen */
		print_history_header();

		row = 0;
		for (i = first_item; row <= page_size && i < max_item; i++)
		{
			strnfmt(buf, sizeof(buf), "%10ld%7d\'  %s",
				(long)history_list_local[i].turn,
				history_list_local[i].dlev * 50,
				history_list_local[i].event);

			if (hist_has(history_list_local[i].type, HIST_ARTIFACT_LOST))
				my_strcat(buf, " (LOST)", sizeof(buf));

			/* Size of header = 3 lines */
			prt(buf, row + 2, 0);
			row++;
		}
		prt("[Arrow keys scroll, p/PgUp for previous page, n/PgDn for next page, ESC to exit.]", hgt - 1, 0);

		ch = inkey();

		switch (ch.code) {
			case 'n':
			case ' ':
			case KC_PGDOWN: {
				size_t scroll_to = first_item + page_size;
				first_item = (scroll_to < max_item ? scroll_to : max_item);
				break;
			}

			case 'p':
			case KC_PGUP: {
				int scroll_to = first_item - page_size;
				first_item = (scroll_to >= 0 ? scroll_to : 0);
				break;
			}

			case 'j':
			case ARROW_DOWN: {
				size_t scroll_to = first_item + 1;
				first_item = (scroll_to < max_item ? scroll_to : max_item);
				break;
			}

			case 'k':
			case ARROW_UP: {
				int scroll_to = first_item - 1;
				first_item = (scroll_to >= 0 ? scroll_to : 0);
				break;
			}

			case ESCAPE:
				active = false;
				break;
		}
	}

	screen_load();

	return;
}